

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeCallRef
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,bool isReturn)

{
  bool bVar1;
  size_t size;
  CallRef *expr;
  Signature SVar2;
  optional<wasm::HeapType> ht;
  Ok local_191;
  uintptr_t local_190;
  Err local_188;
  Err *local_168;
  Err *err_1;
  undefined1 local_158 [8];
  Result<wasm::Ok> _val_1;
  Err local_128;
  Err *local_108;
  Err *err;
  undefined1 local_f8;
  undefined3 uStack_f7;
  ChildPopper local_f0;
  undefined1 local_e8 [8];
  Result<wasm::Ok> _val;
  Signature sig;
  allocator<char> local_89;
  Err local_88;
  undefined1 local_68 [8];
  CallRef curr;
  bool isReturn_local;
  IRBuilder *this_local;
  HeapType type_local;
  
  curr._63_1_ = isReturn;
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  CallRef::CallRef((CallRef *)local_68,&this->wasm->allocator);
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  if (bVar1) {
    SVar2 = HeapType::getSignature((HeapType *)&this_local);
    join_0x00000010_0x00000000_ = HeapType::getSignature((HeapType *)&this_local);
    size = wasm::Type::size((Type *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression.type,size);
    ChildPopper::ChildPopper(&local_f0,this);
    std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
              ((optional<wasm::HeapType> *)&err,(HeapType *)&this_local);
    ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
    ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
    ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_f8;
    ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_f7;
    ChildPopper::visitCallRef((Result<wasm::Ok> *)local_e8,&local_f0,(CallRef *)local_68,ht);
    local_108 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_e8);
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_108 != (Err *)0x0;
    if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
      wasm::Err::Err(&local_128,local_108);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_128);
      wasm::Err::~Err(&local_128);
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_e8);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      err_1 = (Err *)this_local;
      anon_unknown_282::validateTypeAnnotation
                ((Result<wasm::Ok> *)local_158,(HeapType)this_local,
                 (Expression *)curr.operands.allocator);
      local_168 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_158);
      bVar1 = local_168 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_188,local_168);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_188);
        wasm::Err::~Err(&local_188);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_158);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        sig.params = SVar2.results.id;
        local_190 = sig.params.id;
        expr = Builder::makeCallRef<ArenaVector<wasm::Expression*>>
                         (&this->builder,(Expression *)curr.operands.allocator,
                          (ArenaVector<wasm::Expression_*> *)
                          &curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression.
                           type,sig.params,(bool)(curr._63_1_ & 1));
        push(this,(Expression *)expr);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_191);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"expected function type",&local_89);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_88);
    wasm::Err::~Err(&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeCallRef(HeapType type, bool isReturn) {
  CallRef curr(wasm.allocator);
  if (!type.isSignature()) {
    return Err{"expected function type"};
  }
  auto sig = type.getSignature();
  curr.operands.resize(type.getSignature().params.size());
  CHECK_ERR(ChildPopper{*this}.visitCallRef(&curr, type));
  CHECK_ERR(validateTypeAnnotation(type, curr.target));
  push(builder.makeCallRef(curr.target, curr.operands, sig.results, isReturn));
  return Ok{};
}